

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

void fio_message_metadata_callback_set(fio_msg_metadata_fn callback,int enable)

{
  int enable_local;
  fio_msg_metadata_fn callback_local;
  
  if (callback != (fio_msg_metadata_fn)0x0) {
    fio_lock(&fio_postoffice.meta.lock);
    fio_meta_ary_remove2(&fio_postoffice.meta.ary,callback,(fio_msg_metadata_fn *)0x0);
    if (enable != 0) {
      fio_meta_ary_push(&fio_postoffice.meta.ary,callback);
    }
    fio_unlock(&fio_postoffice.meta.lock);
  }
  return;
}

Assistant:

void fio_message_metadata_callback_set(fio_msg_metadata_fn callback,
                                       int enable) {
  if (!callback)
    return;
  fio_lock(&fio_postoffice.meta.lock);
  fio_meta_ary_remove2(&fio_postoffice.meta.ary, callback, NULL);
  if (enable)
    fio_meta_ary_push(&fio_postoffice.meta.ary, callback);
  fio_unlock(&fio_postoffice.meta.lock);
}